

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O2

void Abc_SclUpdateLoad(SC_Man *p,Abc_Obj_t *pObj,SC_Cell *pOld,SC_Cell *pNew)

{
  SC_Pair SVar1;
  uint uVar2;
  SC_Pair *pSVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  SC_Pair SVar7;
  
  for (lVar6 = 0; lVar6 < (pObj->vFanins).nSize; lVar6 = lVar6 + 1) {
    pSVar3 = p->pLoads;
    uVar2 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]] + 0x10);
    pvVar4 = Vec_PtrEntry(&pOld->vPins,(int)lVar6);
    pvVar5 = Vec_PtrEntry(&pNew->vPins,(int)lVar6);
    SVar1 = pSVar3[uVar2];
    SVar7.rise = SVar1.rise +
                 ((float)*(undefined8 *)((long)pvVar5 + 0x10) -
                 (float)*(undefined8 *)((long)pvVar4 + 0x10));
    SVar7.fall = SVar1.fall +
                 ((float)((ulong)*(undefined8 *)((long)pvVar5 + 0x10) >> 0x20) -
                 (float)((ulong)*(undefined8 *)((long)pvVar4 + 0x10) >> 0x20));
    pSVar3[uVar2] = SVar7;
  }
  return;
}

Assistant:

void Abc_SclUpdateLoad( SC_Man * p, Abc_Obj_t * pObj, SC_Cell * pOld, SC_Cell * pNew )
{
    Abc_Obj_t * pFanin;
    int k;
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
        SC_Pin * pPinOld = SC_CellPin( pOld, k );
        SC_Pin * pPinNew = SC_CellPin( pNew, k );
        pLoad->rise += pPinNew->rise_cap - pPinOld->rise_cap;
        pLoad->fall += pPinNew->fall_cap - pPinOld->fall_cap;
    }
}